

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdesolver_smooth.c
# Opt level: O3

int main(int argc,char **argv)

{
  uint time_iter;
  uint space_iter;
  int iVar1;
  double *results [8];
  Gas_parameters gas_parameters;
  Iterative_Method_parameters method_parameters;
  double *apdStack_d8 [9];
  Gas_parameters local_90;
  Iterative_Method_parameters local_68;
  
  initialize_iterative_algorithm_parameters(&local_68,argc,argv);
  print_iterative_algorithm_info(&local_68);
  gas_parameters_Initialize(&local_90);
  results_Construct(apdStack_d8,0x10);
  time_iter = 0;
  iVar1 = 0;
  do {
    space_iter = 0;
    do {
      process_iteration(&local_68,&local_90,time_iter,space_iter,space_iter + iVar1,apdStack_d8);
      space_iter = space_iter + 1;
    } while (space_iter != 4);
    time_iter = time_iter + 1;
    iVar1 = iVar1 + 4;
  } while (time_iter != 4);
  export_results(apdStack_d8,0x10);
  results_Destruct(apdStack_d8);
  return 0;
}

Assistant:

int main (int argc, char * argv[])
{
  Iterative_Method_parameters method_parameters;
  Gas_parameters gas_parameters;

  double * results[RESULTS_SIZE];
  unsigned global_iter = 0,
           time_iter   = 0,
           space_iter  = 0;

  /* Initialize global structures */
  initialize_iterative_algorithm_parameters (&method_parameters, argc, argv);
  print_iterative_algorithm_info (&method_parameters);
  gas_parameters_Initialize (&gas_parameters);
  results_Construct (results, time_maxiter * space_maxiter);

  /* The main loop */
  for (time_iter = 0; time_iter < time_maxiter; time_iter++) {
    for (space_iter = 0; space_iter < space_maxiter; space_iter++) {
      process_iteration(&method_parameters, &gas_parameters,
                        time_iter, space_iter, global_iter, results);
      global_iter++;
    }
  }

  /* Export results and cleanup */
  export_results (results, time_maxiter * space_maxiter);
  results_Destruct (results);

  return 0;
}